

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_> *
msgpack11::MsgPack::parse_multi
          (vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_> *__return_storage_ptr__,
          string *in,size_type *parser_stop_pos,string *err)

{
  string *psVar1;
  string *psVar2;
  byte local_81;
  undefined1 local_60 [24];
  string *local_48;
  MsgPackParser parser;
  string *err_local;
  size_type *parser_stop_pos_local;
  string *in_local;
  vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_> *msgpack_vec;
  
  parser.buffer = (string *)0x0;
  parser.err._0_1_ = 0;
  *parser_stop_pos = 0;
  local_60[0x17] = 0;
  local_48 = in;
  parser.i = (size_t)err;
  parser._24_8_ = err;
  std::vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>::vector
            (__return_storage_ptr__);
  while( true ) {
    psVar1 = parser.buffer;
    psVar2 = (string *)std::__cxx11::string::size();
    local_81 = 0;
    if (psVar1 != psVar2) {
      local_81 = (byte)parser.err ^ 0xff;
    }
    if ((local_81 & 1) == 0) break;
    anon_unknown_0::MsgPackParser::parse_msgpack((MsgPackParser *)local_60,(int)&local_48);
    std::vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_>::push_back
              (__return_storage_ptr__,(value_type *)local_60);
    ~MsgPack((MsgPack *)local_60);
    if (((byte)parser.err & 1) == 0) {
      *parser_stop_pos = (size_type)parser.buffer;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<MsgPack> MsgPack::parse_multi(const string &in,
                                     std::string::size_type &parser_stop_pos,
                                     string &err) {
    MsgPackParser parser { in, 0, err, false };
    parser_stop_pos = 0;
    vector<MsgPack> msgpack_vec;
    while (parser.i != in.size() && !parser.failed) {
        msgpack_vec.push_back(parser.parse_msgpack(0));
        if (!parser.failed)
            parser_stop_pos = parser.i;
    }
    return msgpack_vec;
}